

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcRr.c
# Opt level: O3

int Abc_NtkRRWindow(Abc_RRMan_t *p)

{
  uint *puVar1;
  undefined4 uVar2;
  Abc_Obj_t *pAVar3;
  long *plVar4;
  long *plVar5;
  long lVar6;
  long lVar7;
  void *pvVar8;
  Vec_Ptr_t *pVVar9;
  uint uVar10;
  uint uVar11;
  int iVar12;
  int *piVar13;
  void **ppvVar14;
  Vec_Ptr_t *pVVar15;
  Abc_Ntk_t *pAVar16;
  char *pcVar17;
  Abc_Obj_t *pAVar18;
  Abc_Obj_t *pAVar19;
  uint LevelLimit;
  long lVar20;
  ulong uVar21;
  ulong uVar22;
  bool bVar23;
  uint uVar24;
  uint uVar25;
  int Fill;
  Abc_Obj_t *extraout_RDX;
  Abc_Obj_t *extraout_RDX_00;
  Abc_Obj_t *pAVar26;
  ulong extraout_RDX_01;
  ulong uVar27;
  ulong extraout_RDX_02;
  ulong extraout_RDX_03;
  ulong extraout_RDX_04;
  int iVar28;
  long lVar29;
  Vec_Ptr_t *pVVar30;
  long lVar31;
  Abc_Ntk_t *pAVar32;
  
  pAVar18 = p->pFanout;
  pAVar19 = pAVar18;
  if (pAVar18 == (Abc_Obj_t *)0x0) {
    pAVar19 = p->pNode;
  }
  pAVar18 = (&p->pNode)[pAVar18 == (Abc_Obj_t *)0x0];
  pAVar32 = p->pNtk;
  pAVar3 = p->pFanin;
  uVar10 = (*(uint *)&pAVar3->field_0x14 >> 0xc) - p->nFaninLevels;
  LevelLimit = 0;
  if (0 < (int)uVar10) {
    LevelLimit = uVar10;
  }
  uVar10 = (*(uint *)&pAVar19->field_0x14 >> 0xc) + p->nFanoutLevels;
  pAVar26 = pAVar19;
  if ((pAVar32->vTravIds).pArray == (int *)0x0) {
    iVar12 = pAVar32->vObjs->nSize;
    uVar27 = (long)iVar12 + 500;
    iVar28 = (int)uVar27;
    if ((pAVar32->vTravIds).nCap < iVar28) {
      piVar13 = (int *)malloc(uVar27 * 4);
      (pAVar32->vTravIds).pArray = piVar13;
      if (piVar13 == (int *)0x0) goto LAB_0029ee6f;
      (pAVar32->vTravIds).nCap = iVar28;
      pAVar26 = extraout_RDX;
    }
    else {
      piVar13 = (int *)0x0;
    }
    if (-500 < iVar12) {
      memset(piVar13,0,(uVar27 & 0xffffffff) << 2);
      pAVar26 = extraout_RDX_00;
    }
    (pAVar32->vTravIds).nSize = iVar28;
  }
  iVar12 = pAVar32->nTravIds;
  pAVar32->nTravIds = iVar12 + 1;
  if (iVar12 < 0x3fffffff) {
    pAVar32 = pAVar3->pNtk;
    iVar12 = pAVar3->Id;
    iVar28 = pAVar32->nTravIds;
    Vec_IntFillExtra(&pAVar32->vTravIds,iVar12 + 1,(int)pAVar26);
    if (((long)iVar12 < 0) || ((pAVar32->vTravIds).nSize <= iVar12)) {
LAB_0029ed96:
      __assert_fail("i >= 0 && i < p->nSize",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                    ,0x1c0,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
    }
    (pAVar32->vTravIds).pArray[iVar12] = iVar28;
    pAVar3 = p->pFanin;
    pVVar15 = p->vFaninLeaves;
    uVar24 = pVVar15->nSize;
    if (uVar24 == pVVar15->nCap) {
      if ((int)uVar24 < 0x10) {
        if (pVVar15->pArray == (void **)0x0) {
          ppvVar14 = (void **)malloc(0x80);
        }
        else {
          ppvVar14 = (void **)realloc(pVVar15->pArray,0x80);
        }
        pVVar15->pArray = ppvVar14;
        pVVar15->nCap = 0x10;
      }
      else {
        if (pVVar15->pArray == (void **)0x0) {
          ppvVar14 = (void **)malloc((ulong)uVar24 << 4);
        }
        else {
          ppvVar14 = (void **)realloc(pVVar15->pArray,(ulong)uVar24 << 4);
        }
        pVVar15->pArray = ppvVar14;
        pVVar15->nCap = uVar24 * 2;
      }
    }
    else {
      ppvVar14 = pVVar15->pArray;
    }
    iVar12 = pVVar15->nSize;
    uVar24 = iVar12 + 1;
    uVar27 = (ulong)uVar24;
    pVVar15->nSize = uVar24;
    ppvVar14[iVar12] = pAVar3;
    do {
      pVVar15 = p->vFaninLeaves;
      lVar29 = (long)pVVar15->nSize;
      if (lVar29 < 1) break;
      lVar20 = 0;
      uVar21 = 0;
      do {
        uVar27 = uVar21;
        uVar24 = *(uint *)((long)pVVar15->pArray[lVar20] + 0x14) >> 0xc;
        uVar21 = (ulong)uVar24;
        if (uVar24 < (uint)uVar27) {
          uVar21 = uVar27;
        }
        lVar20 = lVar20 + 1;
      } while (lVar29 != lVar20);
      uVar24 = (uint)uVar21;
      if (uVar24 <= LevelLimit) break;
      lVar20 = 0;
      do {
        if (pVVar15->nSize <= lVar20) goto LAB_0029edb5;
        plVar4 = (long *)pVVar15->pArray[lVar20];
        if ((uVar24 == *(uint *)((long)plVar4 + 0x14) >> 0xc) && (0 < *(int *)((long)plVar4 + 0x1c))
           ) {
          lVar31 = 0;
          do {
            plVar5 = *(long **)(*(long *)(*(long *)(*plVar4 + 0x20) + 8) +
                               (long)*(int *)(plVar4[4] + lVar31 * 4) * 8);
            lVar6 = *plVar5;
            iVar12 = (int)plVar5[2];
            Vec_IntFillExtra((Vec_Int_t *)(lVar6 + 0xe0),iVar12 + 1,(int)uVar27);
            if (((long)iVar12 < 0) || (*(int *)(lVar6 + 0xe4) <= iVar12)) goto LAB_0029ed77;
            lVar7 = *plVar5;
            iVar28 = *(int *)(lVar7 + 0xd8);
            uVar27 = extraout_RDX_01;
            if (*(int *)(*(long *)(lVar6 + 0xe8) + (long)iVar12 * 4) != iVar28) {
              iVar12 = (int)plVar5[2];
              Vec_IntFillExtra((Vec_Int_t *)(lVar7 + 0xe0),iVar12 + 1,(int)extraout_RDX_01);
              if (((long)iVar12 < 0) || (*(int *)(lVar7 + 0xe4) <= iVar12)) goto LAB_0029ed96;
              *(int *)(*(long *)(lVar7 + 0xe8) + (long)iVar12 * 4) = iVar28;
              uVar25 = pVVar15->nSize;
              if (uVar25 == pVVar15->nCap) {
                if ((int)uVar25 < 0x10) {
                  if (pVVar15->pArray == (void **)0x0) {
                    ppvVar14 = (void **)malloc(0x80);
                  }
                  else {
                    ppvVar14 = (void **)realloc(pVVar15->pArray,0x80);
                  }
                  pVVar15->pArray = ppvVar14;
                  pVVar15->nCap = 0x10;
                }
                else {
                  if (pVVar15->pArray == (void **)0x0) {
                    ppvVar14 = (void **)malloc((ulong)uVar25 << 4);
                  }
                  else {
                    ppvVar14 = (void **)realloc(pVVar15->pArray,(ulong)uVar25 << 4);
                  }
                  pVVar15->pArray = ppvVar14;
                  pVVar15->nCap = uVar25 * 2;
                }
              }
              else {
                ppvVar14 = pVVar15->pArray;
              }
              iVar12 = pVVar15->nSize;
              uVar25 = iVar12 + 1;
              uVar27 = (ulong)uVar25;
              pVVar15->nSize = uVar25;
              ppvVar14[iVar12] = plVar5;
            }
            lVar31 = lVar31 + 1;
          } while (lVar31 < *(int *)((long)plVar4 + 0x1c));
        }
        lVar20 = lVar20 + 1;
      } while (lVar20 != lVar29);
      uVar25 = pVVar15->nSize;
      if ((long)(int)uVar25 < 1) {
        iVar12 = 0;
      }
      else {
        uVar27 = 0;
        uVar21 = 0;
        do {
          pvVar8 = pVVar15->pArray[uVar27];
          uVar22 = uVar21;
          if (uVar24 != *(uint *)((long)pvVar8 + 0x14) >> 0xc) {
            uVar11 = (uint)uVar21;
            if (((int)uVar11 < 0) || (uVar25 <= uVar11)) goto LAB_0029edd4;
            uVar22 = (ulong)(uVar11 + 1);
            pVVar15->pArray[uVar21] = pvVar8;
          }
          iVar12 = (int)uVar22;
          uVar27 = uVar27 + 1;
          uVar21 = uVar22;
        } while ((long)(int)uVar25 != uVar27);
      }
      if ((int)uVar25 < iVar12) goto LAB_0029edf3;
      pVVar15->nSize = iVar12;
    } while (iVar12 < 0x7d1);
    pAVar32 = p->pNtk;
    if ((pAVar32->vTravIds).pArray == (int *)0x0) {
      iVar12 = pAVar32->vObjs->nSize;
      uVar21 = (long)iVar12 + 500;
      iVar28 = (int)uVar21;
      if ((pAVar32->vTravIds).nCap < iVar28) {
        piVar13 = (int *)malloc(uVar21 * 4);
        (pAVar32->vTravIds).pArray = piVar13;
        if (piVar13 == (int *)0x0) goto LAB_0029ee6f;
        (pAVar32->vTravIds).nCap = iVar28;
        uVar27 = extraout_RDX_02;
      }
      else {
        piVar13 = (int *)0x0;
      }
      if (-500 < iVar12) {
        memset(piVar13,0,(uVar21 & 0xffffffff) << 2);
        uVar27 = extraout_RDX_03;
      }
      (pAVar32->vTravIds).nSize = iVar28;
    }
    iVar12 = pAVar32->nTravIds;
    pAVar32->nTravIds = iVar12 + 1;
    if (iVar12 < 0x3fffffff) {
      pVVar15 = p->vFaninLeaves;
      if (0 < pVVar15->nSize) {
        lVar29 = 0;
        do {
          lVar20 = *pVVar15->pArray[lVar29];
          iVar12 = (int)*(long *)((long)pVVar15->pArray[lVar29] + 0x10);
          uVar2 = *(undefined4 *)(lVar20 + 0xd8);
          Vec_IntFillExtra((Vec_Int_t *)(lVar20 + 0xe0),iVar12 + 1,(int)uVar27);
          if (((long)iVar12 < 0) || (*(int *)(lVar20 + 0xe4) <= iVar12)) goto LAB_0029ed96;
          *(undefined4 *)(*(long *)(lVar20 + 0xe8) + (long)iVar12 * 4) = uVar2;
          lVar29 = lVar29 + 1;
          pVVar15 = p->vFaninLeaves;
          uVar27 = extraout_RDX_04;
        } while (lVar29 < pVVar15->nSize);
      }
      do {
        pVVar15 = p->vFaninLeaves;
        pVVar30 = p->vFanoutRoots;
        uVar24 = pVVar15->nSize;
        lVar29 = (long)(int)uVar24;
        if (lVar29 < 1) {
          if ((int)uVar10 < 1000000000) goto LAB_0029eaab;
LAB_0029ea89:
          uVar11 = 0;
        }
        else {
          uVar25 = 1000000000;
          lVar20 = 0;
          do {
            uVar24 = *(uint *)((long)pVVar15->pArray[lVar20] + 0x14) >> 0xc;
            if (uVar25 < uVar24) {
              uVar24 = uVar25;
            }
            uVar25 = uVar24;
            lVar20 = lVar20 + 1;
          } while (lVar29 != lVar20);
          if ((int)uVar10 < (int)uVar25) goto LAB_0029eaab;
          lVar20 = 0;
          do {
            if (pVVar15->nSize <= lVar20) {
LAB_0029edb5:
              __assert_fail("i >= 0 && i < p->nSize",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecPtr.h"
                            ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
            }
            pAVar3 = (Abc_Obj_t *)pVVar15->pArray[lVar20];
            if ((uVar25 == *(uint *)&pAVar3->field_0x14 >> 0xc) &&
               (uVar24 = (pAVar3->vFanouts).nSize, uVar27 = (ulong)uVar24, 0 < (int)uVar24)) {
              bVar23 = true;
              lVar31 = 0;
              do {
                while( true ) {
                  pAVar26 = (Abc_Obj_t *)
                            pAVar3->pNtk->vObjs->pArray[(pAVar3->vFanouts).pArray[lVar31]];
                  uVar24 = *(uint *)&pAVar26->field_0x14 >> 0xc;
                  if ((uVar10 < uVar24) || ((*(uint *)&pAVar26->field_0x14 & 0xf) - 3 < 2)) break;
                  if ((pAVar3 != pAVar18) || (pAVar26 != pAVar19)) {
                    pAVar32 = pAVar26->pNtk;
                    iVar12 = pAVar26->Id;
                    Vec_IntFillExtra(&pAVar32->vTravIds,iVar12 + 1,uVar24);
                    if (((long)iVar12 < 0) || ((pAVar32->vTravIds).nSize <= iVar12)) {
LAB_0029ed77:
                      __assert_fail("i >= 0 && i < p->nSize",
                                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                                    ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
                    }
                    pAVar16 = pAVar26->pNtk;
                    iVar28 = pAVar16->nTravIds;
                    if ((pAVar32->vTravIds).pArray[iVar12] != iVar28) {
                      iVar12 = pAVar26->Id;
                      Vec_IntFillExtra(&pAVar16->vTravIds,iVar12 + 1,Fill);
                      if (((long)iVar12 < 0) || ((pAVar16->vTravIds).nSize <= iVar12))
                      goto LAB_0029ed96;
                      (pAVar16->vTravIds).pArray[iVar12] = iVar28;
                      uVar24 = pVVar15->nSize;
                      if (uVar24 == pVVar15->nCap) {
                        if ((int)uVar24 < 0x10) {
                          if (pVVar15->pArray == (void **)0x0) {
                            ppvVar14 = (void **)malloc(0x80);
                          }
                          else {
                            ppvVar14 = (void **)realloc(pVVar15->pArray,0x80);
                          }
                          pVVar15->pArray = ppvVar14;
                          pVVar15->nCap = 0x10;
                        }
                        else {
                          if (pVVar15->pArray == (void **)0x0) {
                            ppvVar14 = (void **)malloc((ulong)uVar24 << 4);
                          }
                          else {
                            ppvVar14 = (void **)realloc(pVVar15->pArray,(ulong)uVar24 << 4);
                          }
                          pVVar15->pArray = ppvVar14;
                          pVVar15->nCap = uVar24 * 2;
                        }
                      }
                      else {
                        ppvVar14 = pVVar15->pArray;
                      }
                      iVar12 = pVVar15->nSize;
                      pVVar15->nSize = iVar12 + 1;
                      ppvVar14[iVar12] = pAVar26;
                    }
                  }
                  lVar31 = lVar31 + 1;
                  uVar27 = (ulong)(pAVar3->vFanouts).nSize;
                  if ((long)uVar27 <= lVar31) {
                    if (bVar23) goto LAB_0029ea21;
                    goto LAB_0029e9a3;
                  }
                }
                lVar31 = lVar31 + 1;
                bVar23 = false;
              } while (lVar31 < (int)uVar27);
LAB_0029e9a3:
              uVar24 = pVVar30->nSize;
              if (uVar24 == pVVar30->nCap) {
                if ((int)uVar24 < 0x10) {
                  if (pVVar30->pArray == (void **)0x0) {
                    ppvVar14 = (void **)malloc(0x80);
                  }
                  else {
                    ppvVar14 = (void **)realloc(pVVar30->pArray,0x80);
                  }
                  pVVar30->pArray = ppvVar14;
                  pVVar30->nCap = 0x10;
                }
                else {
                  if (pVVar30->pArray == (void **)0x0) {
                    ppvVar14 = (void **)malloc((ulong)uVar24 << 4);
                  }
                  else {
                    ppvVar14 = (void **)realloc(pVVar30->pArray,(ulong)uVar24 << 4);
                  }
                  pVVar30->pArray = ppvVar14;
                  pVVar30->nCap = uVar24 * 2;
                }
              }
              else {
                ppvVar14 = pVVar30->pArray;
              }
              iVar12 = pVVar30->nSize;
              pVVar30->nSize = iVar12 + 1;
              ppvVar14[iVar12] = pAVar3;
            }
LAB_0029ea21:
            lVar20 = lVar20 + 1;
          } while (lVar20 != lVar29);
          uVar24 = pVVar15->nSize;
          if ((long)(int)uVar24 < 1) goto LAB_0029ea89;
          lVar29 = 0;
          uVar11 = 0;
          do {
            pvVar8 = pVVar15->pArray[lVar29];
            if (uVar25 != *(uint *)((long)pvVar8 + 0x14) >> 0xc) {
              if (((int)uVar11 < 0) || (uVar24 <= uVar11)) {
LAB_0029edd4:
                __assert_fail("i >= 0 && i < p->nSize",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecPtr.h"
                              ,0x1a6,"void Vec_PtrWriteEntry(Vec_Ptr_t *, int, void *)");
              }
              uVar27 = (ulong)uVar11;
              uVar11 = uVar11 + 1;
              pVVar15->pArray[uVar27] = pvVar8;
            }
            lVar29 = lVar29 + 1;
          } while ((int)uVar24 != lVar29);
        }
        if ((int)uVar24 < (int)uVar11) {
LAB_0029edf3:
          __assert_fail("p->nSize >= nSizeNew",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecPtr.h"
                        ,0x232,"void Vec_PtrShrink(Vec_Ptr_t *, int)");
        }
        pVVar15->nSize = uVar11;
      } while ((int)uVar11 < 0x7d1);
      pVVar30 = p->vFanoutRoots;
LAB_0029eaab:
      if (0 < pVVar30->nSize) {
        lVar29 = 0;
        do {
          puVar1 = (uint *)((long)pVVar30->pArray[lVar29] + 0x14);
          *puVar1 = *puVar1 | 0x10;
          lVar29 = lVar29 + 1;
          pVVar30 = p->vFanoutRoots;
        } while (lVar29 < pVVar30->nSize);
      }
      iVar12 = Abc_NtkRRTfo_rec(pAVar19,p->vRoots,uVar10 + 1);
      pVVar15 = p->vFanoutRoots;
      if (0 < pVVar15->nSize) {
        lVar29 = 0;
        do {
          puVar1 = (uint *)((long)pVVar15->pArray[lVar29] + 0x14);
          *puVar1 = *puVar1 & 0xffffffef;
          lVar29 = lVar29 + 1;
          pVVar15 = p->vFanoutRoots;
        } while (lVar29 < pVVar15->nSize);
      }
      if (iVar12 == 0) {
        iVar12 = 0;
      }
      else {
        pAVar32 = p->pNtk;
        if ((pAVar32->vTravIds).pArray == (int *)0x0) {
          iVar12 = pAVar32->vObjs->nSize;
          uVar27 = (long)iVar12 + 500;
          iVar28 = (int)uVar27;
          if ((pAVar32->vTravIds).nCap < iVar28) {
            piVar13 = (int *)malloc(uVar27 * 4);
            (pAVar32->vTravIds).pArray = piVar13;
            if (piVar13 == (int *)0x0) {
LAB_0029ee6f:
              __assert_fail("p->pArray",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                            ,0x20c,"void Vec_IntGrow(Vec_Int_t *, int)");
            }
            (pAVar32->vTravIds).nCap = iVar28;
          }
          else {
            piVar13 = (int *)0x0;
          }
          if (-500 < iVar12) {
            memset(piVar13,0,(uVar27 & 0xffffffff) << 2);
          }
          (pAVar32->vTravIds).nSize = iVar28;
        }
        iVar12 = pAVar32->nTravIds;
        pAVar32->nTravIds = iVar12 + 1;
        if (0x3ffffffe < iVar12) goto LAB_0029ee31;
        pVVar15 = p->vRoots;
        if (0 < pVVar15->nSize) {
          lVar29 = 0;
          do {
            Abc_NtkRRTfi_rec((Abc_Obj_t *)pVVar15->pArray[lVar29],p->vLeaves,p->vCone,LevelLimit);
            lVar29 = lVar29 + 1;
            pVVar15 = p->vRoots;
          } while (lVar29 < pVVar15->nSize);
          pAVar32 = p->pNtk;
        }
        if (pAVar32->ntkType != ABC_NTK_STRASH) {
          __assert_fail("Abc_NtkIsStrash(pNtk)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abci/abcRr.c"
                        ,0x2aa,
                        "Abc_Ntk_t *Abc_NtkWindow(Abc_Ntk_t *, Vec_Ptr_t *, Vec_Ptr_t *, Vec_Ptr_t *)"
                       );
        }
        pVVar30 = p->vLeaves;
        pVVar9 = p->vCone;
        pAVar16 = Abc_NtkAlloc(ABC_NTK_STRASH,pAVar32->ntkFunc,1);
        pcVar17 = Extra_UtilStrsav("temp");
        pAVar16->pName = pcVar17;
        pAVar18 = Abc_AigConst1(pAVar16);
        pAVar19 = Abc_AigConst1(pAVar32);
        (pAVar19->field_6).pCopy = pAVar18;
        if (0 < pVVar30->nSize) {
          lVar29 = 0;
          do {
            pvVar8 = pVVar30->pArray[lVar29];
            pAVar18 = Abc_NtkCreateObj(pAVar16,ABC_OBJ_PI);
            *(Abc_Obj_t **)((long)pvVar8 + 0x40) = pAVar18;
            lVar29 = lVar29 + 1;
          } while (lVar29 < pVVar30->nSize);
        }
        iVar12 = pVVar9->nSize;
        if (0 < iVar12) {
          lVar29 = 0;
          do {
            plVar4 = (long *)pVVar9->pArray[lVar29];
            lVar20 = *(long *)(*(long *)(*plVar4 + 0x20) + 8);
            pAVar18 = Abc_AigAnd((Abc_Aig_t *)pAVar16->pManFunc,
                                 (Abc_Obj_t *)
                                 ((ulong)(*(uint *)((long)plVar4 + 0x14) >> 10 & 1) ^
                                 *(ulong *)(*(long *)(lVar20 + (long)*(int *)plVar4[4] * 8) + 0x40))
                                 ,(Abc_Obj_t *)
                                  ((ulong)(*(uint *)((long)plVar4 + 0x14) >> 0xb & 1) ^
                                  *(ulong *)(*(long *)(lVar20 + (long)((int *)plVar4[4])[1] * 8) +
                                            0x40)));
            plVar4[8] = (long)pAVar18;
            lVar29 = lVar29 + 1;
            iVar12 = pVVar9->nSize;
          } while (lVar29 < iVar12);
        }
        if (iVar12 != pAVar16->nObjCounts[7]) {
          printf("Warning: Structural hashing during windowing reduced %d nodes (this is a bug).\n")
          ;
        }
        if (0 < pVVar15->nSize) {
          lVar29 = 0;
          do {
            pvVar8 = pVVar15->pArray[lVar29];
            if ((*(byte *)((long)pvVar8 + 0x40) & 1) != 0) {
              __assert_fail("!Abc_ObjIsComplement(pObj->pCopy)",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abci/abcRr.c"
                            ,0x2be,
                            "Abc_Ntk_t *Abc_NtkWindow(Abc_Ntk_t *, Vec_Ptr_t *, Vec_Ptr_t *, Vec_Ptr_t *)"
                           );
            }
            pAVar18 = Abc_NtkCreateObj(pAVar16,ABC_OBJ_PO);
            Abc_ObjAddFanin(pAVar18,*(Abc_Obj_t **)((long)pvVar8 + 0x40));
            lVar29 = lVar29 + 1;
          } while (lVar29 < pVVar15->nSize);
        }
        Abc_NtkAddDummyPiNames(pAVar16);
        Abc_NtkAddDummyPoNames(pAVar16);
        iVar12 = Abc_NtkCheck(pAVar16);
        if (iVar12 == 0) {
          puts("Abc_NtkWindow: The network check has failed.");
          pAVar16 = (Abc_Ntk_t *)0x0;
        }
        p->pWnd = pAVar16;
        iVar12 = 1;
      }
      return iVar12;
    }
  }
LAB_0029ee31:
  __assert_fail("p->nTravIds < (1<<30)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abc/abc.h"
                ,0x197,"void Abc_NtkIncrementTravId(Abc_Ntk_t *)");
}

Assistant:

int Abc_NtkRRWindow( Abc_RRMan_t * p )
{
    Abc_Obj_t * pObj, * pEdgeFanin, * pEdgeFanout;
    int i, LevelMin, LevelMax, RetValue;

    // get the edge
    pEdgeFanout = p->pFanout? p->pFanout : p->pNode;
    pEdgeFanin  = p->pFanout? p->pNode : p->pFanin;
    // get the minimum and maximum levels of the window
    LevelMin = Abc_MaxInt( 0, ((int)p->pFanin->Level) - p->nFaninLevels );
    LevelMax = (int)pEdgeFanout->Level + p->nFanoutLevels;

    // start the TFI leaves with the fanin
    Abc_NtkIncrementTravId( p->pNtk );
    Abc_NodeSetTravIdCurrent( p->pFanin );
    Vec_PtrPush( p->vFaninLeaves, p->pFanin );
    // mark the TFI cone and collect the leaves down to the given level
    while ( Abc_NtkRRTfi_int(p->vFaninLeaves, LevelMin) );

    // mark the leaves with the new TravId
    Abc_NtkIncrementTravId( p->pNtk );
    Vec_PtrForEachEntry( Abc_Obj_t *, p->vFaninLeaves, pObj, i )
        Abc_NodeSetTravIdCurrent( pObj );
    // traverse the TFO cone of the leaves (while skipping the edge)
    // (a) mark the nodes in the cone using the current TravId
    // (b) collect the nodes that have external fanouts into p->vFanoutRoots
    while ( Abc_NtkRRTfo_int(p->vFaninLeaves, p->vFanoutRoots, LevelMax, pEdgeFanin, pEdgeFanout) );

    // mark the fanout roots
    Vec_PtrForEachEntry( Abc_Obj_t *, p->vFanoutRoots, pObj, i )
        pObj->fMarkA = 1;
    // collect roots reachable from the fanout (p->vRoots)
    RetValue = Abc_NtkRRTfo_rec( pEdgeFanout, p->vRoots, LevelMax + 1 );
    // unmark the fanout roots
    Vec_PtrForEachEntry( Abc_Obj_t *, p->vFanoutRoots, pObj, i )
        pObj->fMarkA = 0;

    // return if the window is infeasible
    if ( RetValue == 0 )
        return 0;

    // collect the DFS-ordered new cone (p->vCone) and new leaves (p->vLeaves)
    // using the previous marks coming from the TFO cone
    Abc_NtkIncrementTravId( p->pNtk );
    Vec_PtrForEachEntry( Abc_Obj_t *, p->vRoots, pObj, i )
        Abc_NtkRRTfi_rec( pObj, p->vLeaves, p->vCone, LevelMin );

    // create a new network
    p->pWnd = Abc_NtkWindow( p->pNtk, p->vLeaves, p->vCone, p->vRoots );
    return 1;
}